

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

QStringList * __thiscall
QUrlQuery::allQueryItemValues
          (QStringList *__return_storage_ptr__,QUrlQuery *this,QString *key,
          ComponentFormattingOptions encoding)

{
  QUrlQueryPrivate *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QUrlQueryPrivate *)0x0) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QUrlQueryPrivate::recodeFromUser((QString *)&local_58,pQVar1,key);
    iVar2 = QUrlQueryPrivate::findRecodedKey((this->d).d.ptr,(QString *)&local_58,0);
    while( true ) {
      pQVar1 = (this->d).d.ptr;
      if ((pQVar1->itemList).d.size <= (long)iVar2) break;
      QUrlQueryPrivate::recodeToUser
                ((QString *)&local_70,pQVar1,&(pQVar1->itemList).d.ptr[iVar2].second,encoding);
      QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      iVar2 = QUrlQueryPrivate::findRecodedKey((this->d).d.ptr,(QString *)&local_58,iVar2 + 1);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QUrlQuery::allQueryItemValues(const QString &key, QUrl::ComponentFormattingOptions encoding) const
{
    QStringList result;
    if (d) {
        QString encodedKey = d->recodeFromUser(key);
        int idx = d->findRecodedKey(encodedKey);
        while (idx < d->itemList.size()) {
            result << d->recodeToUser(d->itemList.at(idx).second, encoding);
            idx = d->findRecodedKey(encodedKey, idx + 1);
        }
    }
    return result;
}